

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_date(lua_State *L)

{
  undefined8 *puVar1;
  long lVar2;
  ulong *puVar3;
  char *str;
  int iVar4;
  SBuf *sb_00;
  size_t lenx;
  lua_Number lVar5;
  tm *local_178;
  size_t len;
  char *buf;
  char *q;
  MSize retry;
  MSize sz;
  SBuf *sb;
  tm rtm;
  tm *stm;
  time_t t;
  char *s;
  lua_State *L_local;
  SBuf *local_e8;
  char *local_e0;
  GCstr *local_c0;
  ulong *local_b8;
  char *local_b0;
  undefined4 local_a4;
  GCstr *local_a0;
  ulong *local_98;
  char *local_90;
  undefined4 local_4c;
  GCstr *local_48;
  ulong *local_40;
  char *local_20;
  ulong *local_18;
  char *local_10;
  
  s = (char *)L;
  t = (time_t)luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar4 = lua_type((lua_State *)s,2);
  if (iVar4 < 1) {
    local_178 = (tm *)time((time_t *)0x0);
  }
  else {
    lVar5 = luaL_checknumber((lua_State *)s,2);
    local_178 = (tm *)(long)lVar5;
  }
  stm = local_178;
  if (*(char *)t == '!') {
    t = t + 1;
    rtm.tm_zone = (char *)gmtime_r((time_t *)&stm,(tm *)&sb);
  }
  else {
    rtm.tm_zone = (char *)localtime_r((time_t *)&stm,(tm *)&sb);
  }
  if (rtm.tm_zone == (char *)0x0) {
    puVar1 = *(undefined8 **)(s + 0x28);
    *(undefined8 **)(s + 0x28) = puVar1 + 1;
    *puVar1 = 0xffffffffffffffff;
  }
  else {
    iVar4 = strcmp((char *)t,"*t");
    if (iVar4 == 0) {
      lua_createtable((lua_State *)s,0,9);
      setfield((lua_State *)s,"sec",*(int *)rtm.tm_zone);
      setfield((lua_State *)s,"min",*(int *)(rtm.tm_zone + 4));
      setfield((lua_State *)s,"hour",*(int *)(rtm.tm_zone + 8));
      setfield((lua_State *)s,"day",*(int *)(rtm.tm_zone + 0xc));
      setfield((lua_State *)s,"month",*(int *)(rtm.tm_zone + 0x10) + 1);
      setfield((lua_State *)s,"year",*(int *)(rtm.tm_zone + 0x14) + 0x76c);
      setfield((lua_State *)s,"wday",*(int *)(rtm.tm_zone + 0x18) + 1);
      setfield((lua_State *)s,"yday",*(int *)(rtm.tm_zone + 0x1c) + 1);
      setboolfield((lua_State *)s,"isdst",*(int *)(rtm.tm_zone + 0x20));
    }
    else if (*(char *)t == '\0') {
      puVar3 = *(ulong **)(s + 0x28);
      *(ulong **)(s + 0x28) = puVar3 + 1;
      *puVar3 = *(long *)(s + 0x10) + 0x78U | 0xfffd800000000000;
    }
    else {
      lVar2 = *(long *)(s + 0x10);
      sb_00 = (SBuf *)(lVar2 + 200);
      q._4_4_ = 0;
      q._0_4_ = 4;
      for (buf = (char *)t; *buf != '\0'; buf = buf + 1) {
        iVar4 = 1;
        if (*buf == '%') {
          iVar4 = 0x1e;
        }
        q._4_4_ = iVar4 + q._4_4_;
      }
      *(char **)(lVar2 + 0xe0) = s;
      while ((int)q != 0) {
        L_local._4_4_ = q._4_4_;
        local_e8 = sb_00;
        if ((uint)((int)*(undefined8 *)(lVar2 + 0xd0) - (int)*(undefined8 *)(lVar2 + 0xd8)) <
            q._4_4_) {
          local_e0 = lj_buf_need2(sb_00,q._4_4_);
        }
        else {
          local_e0 = *(char **)(lVar2 + 0xd8);
        }
        str = local_e0;
        lenx = strftime(local_e0,(ulong)(uint)((int)*(undefined8 *)(lVar2 + 0xd0) -
                                              (int)*(undefined8 *)(lVar2 + 0xd8)),(char *)t,
                        (tm *)rtm.tm_zone);
        local_b0 = s;
        if (lenx != 0) {
          puVar3 = *(ulong **)(s + 0x28);
          *(ulong **)(s + 0x28) = puVar3 + 1;
          local_c0 = lj_str_new((lua_State *)s,str,lenx);
          local_90 = local_b0;
          local_a4 = 0xfffffffb;
          local_4c = 0xfffffffb;
          *puVar3 = (ulong)local_c0 | 0xfffd800000000000;
          local_10 = local_b0;
          local_20 = "store to dead GC object";
          if (*(ulong *)(*(long *)(s + 0x10) + 0x10) < *(ulong *)(*(long *)(s + 0x10) + 0x18)) {
            return 1;
          }
          local_b8 = puVar3;
          local_a0 = local_c0;
          local_98 = puVar3;
          local_48 = local_c0;
          local_40 = puVar3;
          local_18 = puVar3;
          lj_gc_step((lua_State *)s);
          return 1;
        }
        q._4_4_ = (q._4_4_ | 1) + q._4_4_;
        q._0_4_ = (int)q + -1;
      }
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(os_date)
{
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm *stm;
#if LJ_TARGET_POSIX
  struct tm rtm;
#endif
  if (*s == '!') {  /* UTC? */
    s++;  /* Skip '!' */
#if LJ_TARGET_POSIX
    stm = gmtime_r(&t, &rtm);
#else
    stm = gmtime(&t);
#endif
  } else {
#if LJ_TARGET_POSIX
    stm = localtime_r(&t, &rtm);
#else
    stm = localtime(&t);
#endif
  }
  if (stm == NULL) {  /* Invalid date? */
    setnilV(L->top++);
  } else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  } else if (*s) {
    SBuf *sb = &G(L)->tmpbuf;
    MSize sz = 0, retry = 4;
    const char *q;
    for (q = s; *q; q++)
      sz += (*q == '%') ? 30 : 1;  /* Overflow doesn't matter. */
    setsbufL(sb, L);
    while (retry--) {  /* Limit growth for invalid format or empty result. */
      char *buf = lj_buf_need(sb, sz);
      size_t len = strftime(buf, sbufsz(sb), s, stm);
      if (len) {
	setstrV(L, L->top++, lj_str_new(L, buf, len));
	lj_gc_check(L);
	break;
      }
      sz += (sz|1);
    }
  } else {
    setstrV(L, L->top++, &G(L)->strempty);
  }
  return 1;
}